

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::ListFixedSizeAppend::Append<unsigned_long>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  bool bVar6;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pdVar4 = target + target_offset * 8;
  while (bVar6 = count != 0, count = count - 1, bVar6) {
    psVar3 = pSVar1->sel_vector;
    uVar5 = offset;
    if (psVar3 != (sel_t *)0x0) {
      uVar5 = (ulong)psVar3[offset];
    }
    *(undefined8 *)pdVar4 = *(undefined8 *)(pdVar2 + uVar5 * 8);
    pdVar4 = pdVar4 + 8;
    offset = offset + 1;
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<uint64_t>(adata);
		auto tdata = reinterpret_cast<uint64_t *>(target);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = adata.sel->get_index(offset + i);
			auto target_idx = target_offset + i;
			tdata[target_idx] = sdata[source_idx];
		}
	}